

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_vault_type(chunk_conflict *c,loc centre,char *typ)

{
  _Bool _Var1;
  vault *v_00;
  vault *v;
  char *typ_local;
  chunk_conflict *c_local;
  loc centre_local;
  
  v_00 = random_vault(c->depth,typ);
  if (v_00 == (vault *)0x0) {
    centre_local.x._3_1_ = false;
  }
  else {
    _Var1 = build_vault(c,centre,v_00);
    if (_Var1) {
      if (((player->opts).opt[0x18] & 1U) != 0) {
        msg("%s (%s)",typ,v_00->name);
      }
      add_to_monster_rating((chunk *)c,(uint)v_00->rat);
      centre_local.x._3_1_ = true;
    }
    else {
      centre_local.x._3_1_ = false;
    }
  }
  return centre_local.x._3_1_;
}

Assistant:

static bool build_vault_type(struct chunk *c, struct loc centre,
							 const char *typ)
{
	struct vault *v = random_vault(c->depth, typ);
	if (v == NULL) {
		/*quit_fmt("got NULL from random_vault(%s)", typ);*/
		return false;
	}

	/* Build the vault */
	if (!build_vault(c, centre, v))
		return false;

	ROOM_LOG("%s (%s)", typ, v->name);

	/* Boost the rating */
	add_to_monster_rating(c, v->rat);

	return true;
}